

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O3

uint anchorNameHash(ctmbstr s)

{
  char cVar1;
  uint uVar2;
  uint uVar3;
  char *pcVar4;
  
  uVar2 = 0;
  if ((s != (ctmbstr)0x0) && (cVar1 = *s, uVar2 = 0, cVar1 != '\0')) {
    pcVar4 = s + 1;
    uVar3 = 0;
    do {
      uVar2 = prvTidyToLower((int)cVar1);
      uVar3 = uVar3 * 0x1f + (int)(char)uVar2;
      cVar1 = *pcVar4;
      pcVar4 = pcVar4 + 1;
    } while (cVar1 != '\0');
    uVar2 = uVar3 % 0x3fd;
  }
  return uVar2;
}

Assistant:

static uint anchorNameHash(ctmbstr s)
{
    uint hashval = 0;
    /* Issue #149 - an inferred name can be null. avoid crash */
    if (s) 
    {
        for ( ; *s != '\0'; s++) {
            tmbchar c = TY_(ToLower)( *s );
            hashval = c + 31*hashval;
        }
    }
    return hashval % ANCHOR_HASH_SIZE;
}